

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<Vector2f,_std::allocator<Vector2f>_> *
poly_mul<Vector2f>(vector<Vector2f,_std::allocator<Vector2f>_> *__return_storage_ptr__,
                  vector<Vector2f,_std::allocator<Vector2f>_> *a,Vector2f *b)

{
  pointer pVVar1;
  Vector2f *x;
  pointer pVVar2;
  Vector2f VStack_38;
  
  pVVar1 = (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar2 = (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                super__Vector_impl_data._M_start; pVVar2 != pVVar1; pVVar2 = pVVar2 + 1) {
    operator*(pVVar2,b);
    Vector2f::operator=(pVVar2,&VStack_38);
  }
  pVVar2 = (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
  super__Vector_impl_data._M_finish = pVVar2;
  (__return_storage_ptr__->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (a->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> poly_mul(std::vector<T> a, Vector2f b) {
	for (auto& x : a) x = x * b;
	return a;
}